

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CutoffGroup.hpp
# Opt level: O0

RealType __thiscall OpenMD::CutoffGroup::getMass(CutoffGroup *this)

{
  iterator *in_RDI;
  RealType RVar1;
  CutoffGroup *unaff_retaddr;
  RealType mass;
  Atom *atom;
  iterator i;
  Atom *local_18;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_10;
  iterator *i_00;
  
  if (((ulong)in_RDI[3]._M_current & 1) == 0) {
    in_RDI[4]._M_current = (Atom **)0x0;
    i_00 = in_RDI;
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::__normal_iterator(&local_10);
    local_18 = beginAtom(unaff_retaddr,i_00);
    while (local_18 != (Atom *)0x0) {
      RVar1 = StuntDouble::getMass(&local_18->super_StuntDouble);
      in_RDI[4]._M_current = (Atom **)(RVar1 + (double)in_RDI[4]._M_current);
      local_18 = nextAtom(unaff_retaddr,i_00);
    }
    *(undefined1 *)&in_RDI[3]._M_current = 1;
  }
  return (RealType)in_RDI[4]._M_current;
}

Assistant:

RealType getMass() {
      if (!haveTotalMass) {
        totalMass = 0.0;

        std::vector<Atom*>::iterator i;
        for (Atom* atom = beginAtom(i); atom != NULL; atom = nextAtom(i)) {
          RealType mass = atom->getMass();
          totalMass += mass;
        }

        haveTotalMass = true;
      }

      return totalMass;
    }